

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffcmps(char *templt,char *colname,int casesen,int *match,int *exact)

{
  int iVar1;
  size_t sVar2;
  ushort **ppuVar3;
  undefined4 *in_RCX;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  undefined4 *in_R8;
  char col [71];
  char temp [71];
  int ssave;
  int tsave;
  int wildsearch;
  int s1;
  int t1;
  int found;
  int ii;
  undefined5 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 uVar4;
  undefined1 uVar5;
  char local_e8 [70];
  undefined1 local_a2;
  char local_98 [70];
  undefined1 local_52;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined4 *local_28;
  undefined4 *local_20;
  int local_14;
  char *local_10;
  
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  *in_RCX = 0;
  *in_R8 = 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  strncpy(local_98,in_RDI,0x47);
  strncpy(local_e8,local_10,0x47);
  local_52 = 0;
  local_a2 = 0;
  sVar2 = strlen(local_98);
  local_2c = (int)sVar2 + -1;
  while( true ) {
    uVar5 = false;
    if (-1 < local_2c) {
      uVar5 = local_98[local_2c] == ' ';
    }
    if ((bool)uVar5 == false) break;
    local_98[local_2c] = '\0';
    local_2c = local_2c + -1;
  }
  sVar2 = strlen(local_e8);
  local_2c = (int)sVar2 + -1;
  while( true ) {
    uVar4 = false;
    if (-1 < local_2c) {
      uVar4 = local_e8[local_2c] == ' ';
    }
    if ((bool)uVar4 == false) break;
    local_e8[local_2c] = '\0';
    local_2c = local_2c + -1;
  }
  if (local_14 == 0) {
    ffupch((char *)CONCAT17(uVar5,(uint7)CONCAT15(in_stack_ffffffffffffff15,
                                                  in_stack_ffffffffffffff10)));
    ffupch((char *)CONCAT17(uVar5,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffff15,
                                                          in_stack_ffffffffffffff10))));
  }
  if (((local_98[0] < local_e8[0]) || (local_e8[0] < local_98[0])) ||
     (iVar1 = strcmp(local_98,local_e8), iVar1 != 0)) {
    *local_28 = 0;
    local_34 = 0;
    local_38 = 0;
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            if ((local_98[local_34] == '\0') && (local_e8[local_38] == '\0')) {
              *local_20 = 1;
              return;
            }
            if (local_98[local_34] == '\0') {
              if (local_3c == 0) {
                return;
              }
              local_34 = local_40;
              local_38 = local_44 + 1;
            }
            else if (local_e8[local_38] == '\0') {
              if (local_98[local_34] != '*') {
                return;
              }
              if (local_98[local_34 + 1] != '\0') {
                return;
              }
              *local_20 = 1;
              return;
            }
            if ((local_98[local_34] != local_e8[local_38]) && (local_98[local_34] != '?')) break;
            local_38 = local_38 + 1;
            local_34 = local_34 + 1;
          }
          if ((local_98[local_34] != '#') ||
             (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)local_e8[local_38]] & 0x800) == 0)) break;
          local_34 = local_34 + 1;
          do {
            local_38 = local_38 + 1;
            ppuVar3 = __ctype_b_loc();
          } while (((*ppuVar3)[(int)local_e8[local_38]] & 0x800) != 0);
        }
        if (local_98[local_34] == '*') break;
        if (local_3c == 0) {
          return;
        }
        local_34 = local_40;
        local_38 = local_44 + 1;
      }
      local_3c = 1;
      local_40 = local_34;
      local_44 = local_38;
      local_34 = local_34 + 1;
      if ((local_98[local_34] == '\0') || (local_98[local_34] == ' ')) {
        *local_20 = 1;
        return;
      }
      local_30 = 0;
      while (local_e8[local_38] != '\0' && local_30 == 0) {
        if (local_98[local_34] == local_e8[local_38]) {
          local_34 = local_34 + 1;
          local_38 = local_38 + 1;
          local_30 = 1;
        }
        else {
          local_38 = local_38 + 1;
        }
      }
    } while (local_30 != 0);
  }
  else {
    *local_20 = 1;
  }
  return;
}

Assistant:

void ffcmps(char *templt,   /* I - input template (may have wildcards)      */
            char *colname,  /* I - full column name up to 68 + 1 chars long */
            int  casesen,   /* I - case sensitive string comparison? 1=yes  */
            int  *match,    /* O - do template and colname match? 1=yes     */
            int  *exact)    /* O - do strings exactly match, or wildcards   */
/*
  compare the template to the string and test if they match.
  The strings are limited to 68 characters or less (the max. length
  of a FITS string keyword value.  This routine reports whether
  the two strings match and whether the match is exact or
  involves wildcards.

  This algorithm is very similar to the way unix filename wildcards
  work except that this first treats a wild card as a literal character
  when looking for a match.  If there is no literal match, then
  it interpretes it as a wild card.  So the template 'AB*DE'
  is considered to be an exact rather than a wild card match to
  the string 'AB*DE'.  The '#' wild card in the template string will 
  match any consecutive string of decimal digits in the colname.
  
*/
{
    int ii, found, t1, s1, wildsearch = 0, tsave = 0, ssave = 0;
    char temp[FLEN_VALUE], col[FLEN_VALUE];

    *match = FALSE;
    *exact = TRUE;

    strncpy(temp, templt, FLEN_VALUE); /* copy strings to work area */
    strncpy(col, colname, FLEN_VALUE);
    temp[FLEN_VALUE - 1] = '\0';  /* make sure strings are terminated */
    col[FLEN_VALUE - 1]  = '\0';

    /* truncate trailing non-significant blanks */
    for (ii = strlen(temp) - 1; ii >= 0 && temp[ii] == ' '; ii--)
        temp[ii] = '\0';

    for (ii = strlen(col) - 1; ii >= 0 && col[ii] == ' '; ii--)
        col[ii] = '\0';
       
    if (!casesen)
    {             /* convert both strings to uppercase before comparison */
        ffupch(temp);
        ffupch(col);
    }

    if (!FSTRCMP(temp, col) )
    {
        *match = TRUE;     /* strings exactly match */
        return;
    }

    *exact = FALSE;    /* strings don't exactly match */

    t1 = 0;   /* start comparison with 1st char of each string */
    s1 = 0;

    while(1)  /* compare corresponding chars in each string */
    {
      if (temp[t1] == '\0' && col[s1] == '\0')
      { 
         /* completely scanned both strings so they match */
         *match = TRUE;
         return;
      }
      else if (temp[t1] == '\0')
      { 
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
            /* reached end of template string so they don't match */
            return;
        }
      }
      else if (col[s1] == '\0')
      { 
         /* reached end of other string; they match if the next */
         /* character in the template string is a '*' wild card */

        if (temp[t1] == '*' && temp[t1 + 1] == '\0')
        {
           *match = TRUE;
        }

        return;
      }

      if (temp[t1] == col[s1] || (temp[t1] == '?') )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers and loop back again */
      }
      else if (temp[t1] == '#' && isdigit((int) col[s1]) )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers */

        /* find the end of the string of digits */
        while (isdigit((int) col[s1]) ) 
            s1++;        
      }
      else if (temp[t1] == '*')
      {

        /* save current string locations, in case we need to restart */
        wildsearch = 1;
        tsave = t1;
        ssave = s1;

        /* get next char from template and look for it in the col name */
        t1++;
        if (temp[t1] == '\0' || temp[t1] == ' ')
        {
          /* reached end of template so strings match */
          *match = TRUE;
          return;
        }

        found = FALSE;
        while (col[s1] && !found)
        {
          if (temp[t1] == col[s1])
          {
            t1++;  /* found matching characters; incre both pointers */
            s1++;  /* and loop back to compare next chars */
            found = TRUE;
          }
          else
            s1++;  /* increment the column name pointer and try again */
        }

        if (!found)
        {
          return;  /* hit end of column name and failed to find a match */
        }
      }
      else
      {
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
          return;   /* strings don't match */
        }
      }
    }
}